

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::CrossLinkOnDemandHelper
          (DescriptorPool *this,string_view name,bool expecting_enum)

{
  string_view name_00;
  ulong uVar1;
  char *pcVar2;
  pointer this_00;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [8];
  string lookup_name;
  bool expecting_enum_local;
  DescriptorPool *this_local;
  string_view name_local;
  Symbol result;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (DescriptorPool *)name._M_len;
  lookup_name.field_2._M_local_buf[0xf] = expecting_enum;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_50,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_51);
  std::allocator<char>::~allocator(&local_51);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
    if (*pcVar2 == '.') {
      std::__cxx11::string::substr((ulong)local_88,(ulong)local_50);
      std::__cxx11::string::operator=(local_50,local_88);
      std::__cxx11::string::~string(local_88);
    }
  }
  this_00 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&this->tables_);
  name_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
  name_local._M_str = (char *)Tables::FindByNameHelper(this_00,this,name_00);
  std::__cxx11::string::~string(local_50);
  return (Symbol)(SymbolBase *)name_local._M_str;
}

Assistant:

Symbol DescriptorPool::CrossLinkOnDemandHelper(absl::string_view name,
                                               bool expecting_enum) const {
  (void)expecting_enum;  // Parameter is used by Google-internal code.
  auto lookup_name = std::string(name);
  if (!lookup_name.empty() && lookup_name[0] == '.') {
    lookup_name = lookup_name.substr(1);
  }
  Symbol result = tables_->FindByNameHelper(this, lookup_name);
  return result;
}